

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  string_view str;
  Value value;
  FileDescriptorProto file;
  LogMessage LStack_128;
  FileDescriptorProto local_118;
  
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  bVar1 = MessageLite::ParseFromArray((MessageLite *)&local_118,encoded_file_descriptor,size);
  if (bVar1) {
    value.second = size;
    value.first = encoded_file_descriptor;
    value._12_4_ = 0;
    bVar1 = DescriptorIndex::AddFile<google::protobuf::FileDescriptorProto>
                      ((this->index_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
                       .
                       super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>
                       ._M_head_impl,&local_118,value);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&LStack_128,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x253);
    str._M_str = "Invalid file descriptor data passed to EncodedDescriptorDatabase::Add().";
    str._M_len = 0x48;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&LStack_128,str);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_128);
    bVar1 = false;
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::Add(
    const void* PROTOBUF_NONNULL encoded_file_descriptor, int size) {
  FileDescriptorProto file;
  if (file.ParseFromArray(encoded_file_descriptor, size)) {
    return index_->AddFile(file, std::make_pair(encoded_file_descriptor, size));
  } else {
    ABSL_LOG(ERROR) << "Invalid file descriptor data passed to "
                       "EncodedDescriptorDatabase::Add().";
    return false;
  }
}